

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.h
# Opt level: O3

string * google::protobuf::compiler::java::AnnotationFileName<google::protobuf::ServiceDescriptor>
                   (string *__return_storage_ptr__,ServiceDescriptor *descriptor,string *suffix)

{
  long lVar1;
  long *plVar2;
  size_type *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_38,
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)descriptor,
                 suffix);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_38);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar3) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AnnotationFileName(const Descriptor* descriptor,
                               const std::string& suffix) {
  return descriptor->name() + suffix + ".java.pb.meta";
}